

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_9219d::PedestrianPlugIn::nextPD(PedestrianPlugIn *this)

{
  ProximityDatabase *pPVar1;
  LQProximityDatabase<OpenSteer::AbstractVehicle_*> *this_00;
  ProximityDatabase *pPVar2;
  int iVar3;
  pointer ppPVar4;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  pPVar1 = this->pd;
  iVar3 = (this->cyclePD + 1) % 2;
  this->cyclePD = iVar3;
  if (iVar3 == 1) {
    pPVar2 = (ProximityDatabase *)operator_new(0x20);
    pPVar2->_vptr_AbstractProximityDatabase =
         (_func_int **)&PTR__BruteForceProximityDatabase_001729a8;
    pPVar2[1]._vptr_AbstractProximityDatabase = (_func_int **)0x0;
    pPVar2[2]._vptr_AbstractProximityDatabase = (_func_int **)0x0;
    pPVar2[3]._vptr_AbstractProximityDatabase = (_func_int **)0x0;
    this->pd = pPVar2;
  }
  else if (iVar3 == 0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 20.0;
    local_50.y = 1.0;
    local_50.z = 20.0;
    local_60.x = 80.0;
    local_60.y = 80.0;
    local_60.z = 80.0;
    this_00 = (LQProximityDatabase<OpenSteer::AbstractVehicle_*> *)operator_new(0x10);
    OpenSteer::LQProximityDatabase<OpenSteer::AbstractVehicle_*>::LQProximityDatabase
              (this_00,&local_40,&local_60,&local_50);
    this->pd = (ProximityDatabase *)this_00;
  }
  for (ppPVar4 = (this->crowd).
                 super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar4 !=
      (this->crowd).
      super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppPVar4 = ppPVar4 + 1) {
    Pedestrian::newPD((Pedestrian *)*ppPVar4,this->pd);
  }
  if (pPVar1 != (ProximityDatabase *)0x0) {
    (*pPVar1->_vptr_AbstractProximityDatabase[1])(pPVar1);
  }
  return;
}

Assistant:

void nextPD (void)
    {
        // save pointer to old PD
        ProximityDatabase* oldPD = pd;
        
        // allocate new PD
        const int totalPD = 2;
        switch (cyclePD = (cyclePD + 1) % totalPD)
        {
            case 0:
            {
                const Vec3 center;
                const float div = 20.0f;
                const Vec3 divisions (div, 1.0f, div);
                const float diameter = 80.0f; //XXX need better way to get this
                const Vec3 dimensions (diameter, diameter, diameter);
                typedef LQProximityDatabase<AbstractVehicle*> LQPDAV;
                pd = new LQPDAV (center, dimensions, divisions);
                break;
            }
            case 1:
            {
                pd = new BruteForceProximityDatabase<AbstractVehicle*> ();
                break;
            }
        }
        
        // switch each boid to new PD
        for (iterator i=crowd.begin(); i!=crowd.end(); i++) (**i).newPD(*pd);
        
        // delete old PD (if any)
        delete oldPD;
    }